

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.hpp
# Opt level: O1

void __thiscall Jzon::Node::set(Node *this,string *value)

{
  Type TVar1;
  bool bVar2;
  string local_40;
  
  if (this->data != (Data *)0x0) {
    TVar1 = this->data->type;
    bVar2 = TVar1 == T_NULL;
    if ((!bVar2) && (bVar2 = TVar1 == T_STRING, !bVar2)) {
      bVar2 = TVar1 - T_NUMBER < 2;
    }
    if (bVar2) {
      detach(this);
      this->data->type = T_STRING;
      unescapeString(&local_40,value);
      std::__cxx11::string::operator=((string *)&this->data->valueStr,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

inline bool isObject() const { return (getType() == T_OBJECT);  }